

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_benchmark.cpp
# Opt level: O3

vector<unsigned_char,_std::allocator<unsigned_char>_> *
anon_unknown.dwarf_bc86::read_stdio_prealloc
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          char *file_name)

{
  int iVar1;
  FILE *__stream;
  size_type __n;
  size_t sVar2;
  system_error *psVar3;
  int *piVar4;
  error_category *peVar5;
  allocator_type local_29;
  
  __stream = fopen(file_name,"rb");
  if (__stream == (FILE *)0x0) {
    psVar3 = (system_error *)__cxa_allocate_exception(0x20);
    piVar4 = __errno_location();
    iVar1 = *piVar4;
    peVar5 = (error_category *)std::_V2::system_category();
    std::system_error::system_error(psVar3,iVar1,peVar5);
  }
  else {
    iVar1 = fseek(__stream,0,2);
    if (iVar1 == 0) {
      __n = ftell(__stream);
      rewind(__stream);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (__return_storage_ptr__,__n,&local_29);
      sVar2 = fread((__return_storage_ptr__->
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                    super__Vector_impl_data._M_start,1,__n,__stream);
      fclose(__stream);
      if (sVar2 == __n) {
        return __return_storage_ptr__;
      }
      psVar3 = (system_error *)__cxa_allocate_exception(0x20);
      piVar4 = __errno_location();
      iVar1 = *piVar4;
      peVar5 = (error_category *)std::_V2::system_category();
      std::system_error::system_error(psVar3,iVar1,peVar5);
      __cxa_throw(psVar3,&std::system_error::typeinfo,std::system_error::~system_error);
    }
    fclose(__stream);
    psVar3 = (system_error *)__cxa_allocate_exception(0x20);
    piVar4 = __errno_location();
    iVar1 = *piVar4;
    peVar5 = (error_category *)std::_V2::system_category();
    std::system_error::system_error(psVar3,iVar1,peVar5);
  }
  __cxa_throw(psVar3,&std::system_error::typeinfo,std::system_error::~system_error);
}

Assistant:

std::vector<std::uint8_t> read_stdio_prealloc(const char* file_name)
{
    FILE* file = std::fopen(file_name, "rb");
    if (!file) {
        throw std::system_error{errno, std::system_category()};
    }
    // Seek to the end of the stream to find the size
    if (std::fseek(file, 0, SEEK_END) != 0) {
        std::fclose(file);
        throw std::system_error{errno, std::system_category()};
    }
    std::size_t file_size = std::ftell(file);
    std::rewind(file);

    std::vector<std::uint8_t> output(file_size);
    std::size_t bytes_read = std::fread(output.data(), 1, file_size, file);

    if (bytes_read != file_size) {
        std::fclose(file);
        throw std::system_error{errno, std::system_category()};
    }

    std::fclose(file);

    return output;
}